

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2_enc.c
# Opt level: O0

int jp2_encode(jas_image_t *image,jas_stream_t *out,char *optstr)

{
  bool bVar1;
  int iVar2;
  anon_union_280_8_4db6f6e9_for_data *paVar3;
  uint_fast8_t *puVar4;
  ulong *puVar5;
  uint_fast32_t uVar6;
  long lVar7;
  char *local_10e0;
  byte local_10c4;
  uint local_10c0;
  uint local_10bc;
  uint i_1;
  uint i;
  int sgnd;
  int prec;
  int needcdef;
  int pos;
  jas_stream_t *iccstream;
  jas_iccprof_t *iccprof;
  uint_fast32_t typeasoc;
  jp2_cdef_t *cdef;
  jp2_cdefchan_t *cdefchanent;
  uint_fast32_t overhead;
  char buf [4096];
  jp2_colr_t *colr;
  uint_fast16_t cmptno;
  long len;
  jp2_bpcc_t *bpcc;
  jas_stream_t *pjStack_48;
  int allcmptssame;
  jas_stream_t *tmpstream;
  jp2_ihdr_t *ihdr;
  jp2_ftyp_t *ftyp;
  jp2_box_t *box;
  char *optstr_local;
  jas_stream_t *out_local;
  jas_image_t *image_local;
  
  ftyp = (jp2_ftyp_t *)0x0;
  pjStack_48 = (jas_stream_t *)0x0;
  _needcdef = (jas_stream_t *)0x0;
  iccstream = (jas_stream_t *)0x0;
  if (image->numcmpts_ == 0) {
    jas_eprintf("image must have at least one component\n");
  }
  else {
    bVar1 = true;
    for (local_10bc = 1; local_10bc < image->numcmpts_; local_10bc = local_10bc + 1) {
      if ((image->cmpts_[local_10bc]->sgnd_ != (*image->cmpts_)->sgnd_) ||
         (image->cmpts_[local_10bc]->prec_ != (*image->cmpts_)->prec_)) {
        bVar1 = false;
        break;
      }
    }
    ftyp = (jp2_ftyp_t *)jp2_box_create(0x6a502020);
    if ((jp2_box_t *)ftyp == (jp2_box_t *)0x0) {
      jas_eprintf("cannot create JP box\n");
    }
    else {
      (((jp2_box_t *)ftyp)->data).ftyp.majver = 0xd0a870a;
      iVar2 = jp2_box_put((jp2_box_t *)ftyp,out);
      if (iVar2 == 0) {
        jp2_box_destroy((jp2_box_t *)ftyp);
        ftyp = (jp2_ftyp_t *)jp2_box_create(0x66747970);
        if ((jp2_box_t *)ftyp == (jp2_box_t *)0x0) {
          jas_eprintf("cannot create FTYP box\n");
        }
        else {
          (((jp2_box_t *)ftyp)->data).ftyp.majver = 0x6a703220;
          (((jp2_box_t *)ftyp)->data).ftyp.minver = 0;
          (((jp2_box_t *)ftyp)->data).ftyp.numcompatcodes = 1;
          (((jp2_box_t *)ftyp)->data).pclr.bpc = (uint_fast8_t *)0x6a703220;
          iVar2 = jp2_box_put((jp2_box_t *)ftyp,out);
          if (iVar2 == 0) {
            jp2_box_destroy((jp2_box_t *)ftyp);
            ftyp = (jp2_ftyp_t *)0x0;
            pjStack_48 = jas_stream_memopen((char *)0x0,0);
            if (pjStack_48 == (jas_stream_t *)0x0) {
              jas_eprintf("cannot create temporary stream\n");
            }
            else {
              ftyp = (jp2_ftyp_t *)jp2_box_create(0x69686472);
              if ((jp2_box_t *)ftyp == (jp2_box_t *)0x0) {
                jas_eprintf("cannot create IHDR box\n");
              }
              else {
                (((jp2_box_t *)ftyp)->data).ftyp.majver = image->brx_ - image->tlx_;
                (((jp2_box_t *)ftyp)->data).bpcc.bpcs = (uint_fast8_t *)(image->bry_ - image->tly_);
                *(ulong *)((long)&((jp2_box_t *)ftyp)->data + 0x10) = (ulong)image->numcmpts_;
                if (bVar1) {
                  local_10c4 = (char)(*image->cmpts_)->prec_ - 1U & 0x7f |
                               (byte)(((*image->cmpts_)->sgnd_ & 1U) << 7);
                }
                else {
                  local_10c4 = 0xff;
                }
                (((jp2_box_t *)ftyp)->data).ihdr.bpc = local_10c4;
                (((jp2_box_t *)ftyp)->data).ihdr.comptype = '\a';
                (((jp2_box_t *)ftyp)->data).ihdr.csunk = '\0';
                (((jp2_box_t *)ftyp)->data).ihdr.ipr = '\0';
                iVar2 = jp2_box_put((jp2_box_t *)ftyp,pjStack_48);
                if (iVar2 == 0) {
                  jp2_box_destroy((jp2_box_t *)ftyp);
                  if (!bVar1) {
                    ftyp = (jp2_ftyp_t *)jp2_box_create(0x62706363);
                    if ((jp2_box_t *)ftyp == (jp2_box_t *)0x0) {
                      jas_eprintf("cannot create BPCC box\n");
                      goto LAB_00124535;
                    }
                    paVar3 = &((jp2_box_t *)ftyp)->data;
                    *(ulong *)paVar3 = (ulong)image->numcmpts_;
                    puVar4 = (uint_fast8_t *)jas_alloc2((paVar3->ftyp).majver,1);
                    (((jp2_box_t *)ftyp)->data).bpcc.bpcs = puVar4;
                    if (puVar4 == (uint_fast8_t *)0x0) {
                      jas_eprintf("memory allocation failed\n");
                      goto LAB_00124535;
                    }
                    for (colr = (jp2_colr_t *)0x0; colr < (jp2_colr_t *)(paVar3->ftyp).majver;
                        colr = (jp2_colr_t *)&colr->pri) {
                      (&colr->method)[(long)(((jp2_box_t *)ftyp)->data).bpcc.bpcs] =
                           (char)image->cmpts_[(long)colr]->prec_ - 1U & 0x7f |
                           (byte)((image->cmpts_[(long)colr]->sgnd_ & 1U) << 7);
                    }
                    iVar2 = jp2_box_put((jp2_box_t *)ftyp,pjStack_48);
                    if (iVar2 != 0) {
                      jas_eprintf("cannot write BPCC box\n");
                      goto LAB_00124535;
                    }
                    jp2_box_destroy((jp2_box_t *)ftyp);
                  }
                  ftyp = (jp2_ftyp_t *)jp2_box_create(0x636f6c72);
                  if ((jp2_box_t *)ftyp == (jp2_box_t *)0x0) {
                    jas_eprintf("cannot create COLR box\n");
                  }
                  else {
                    iVar2 = image->clrspc_;
                    if (((iVar2 == 0x301) || (iVar2 == 0x401)) || (iVar2 == 0x501)) {
                      (((jp2_box_t *)ftyp)->data).colr.method = '\x01';
                      iVar2 = clrspctojp2(image->clrspc_);
                      *(long *)((long)&((jp2_box_t *)ftyp)->data + 8) = (long)iVar2;
                      (((jp2_box_t *)ftyp)->data).colr.pri = '\0';
                      (((jp2_box_t *)ftyp)->data).colr.approx = '\0';
                    }
                    else {
                      (((jp2_box_t *)ftyp)->data).colr.method = '\x02';
                      (((jp2_box_t *)ftyp)->data).colr.pri = '\0';
                      (((jp2_box_t *)ftyp)->data).colr.approx = '\0';
                      if (image->cmprof_ == (jas_cmprof_t *)0x0) {
                        jas_eprintf("CM profile is null\n");
                        goto LAB_00124535;
                      }
                      iccstream = (jas_stream_t *)jas_iccprof_createfromcmprof(image->cmprof_);
                      if ((jas_iccprof_t *)iccstream == (jas_iccprof_t *)0x0) {
                        jas_eprintf("cannot create ICC profile\n");
                        goto LAB_00124535;
                      }
                      _needcdef = jas_stream_memopen((char *)0x0,0);
                      if (_needcdef == (jas_stream_t *)0x0) {
                        jas_eprintf("cannot create temporary stream\n");
                        goto LAB_00124535;
                      }
                      iVar2 = jas_iccprof_save((jas_iccprof_t *)iccstream,_needcdef);
                      if (iVar2 != 0) {
                        jas_eprintf("cannot write ICC profile\n");
                        goto LAB_00124535;
                      }
                      lVar7 = jas_stream_tell(_needcdef);
                      iVar2 = (int)lVar7;
                      if (iVar2 < 0) {
                        jas_eprintf("cannot get stream position\n");
                        goto LAB_00124535;
                      }
                      (((jp2_box_t *)ftyp)->data).colr.iccplen = iVar2;
                      puVar4 = (uint_fast8_t *)jas_malloc((long)iVar2);
                      (((jp2_box_t *)ftyp)->data).colr.iccp = puVar4;
                      if (puVar4 == (uint_fast8_t *)0x0) {
                        jas_eprintf("memory allocation failed\n");
                        goto LAB_00124535;
                      }
                      jas_stream_rewind(_needcdef);
                      iVar2 = jas_stream_read(_needcdef,(((jp2_box_t *)ftyp)->data).colr.iccp,
                                              (((jp2_box_t *)ftyp)->data).colr.iccplen);
                      if (iVar2 != (((jp2_box_t *)ftyp)->data).colr.iccplen) {
                        jas_eprintf("cannot read temporary stream\n");
                        goto LAB_00124535;
                      }
                      jas_stream_close(_needcdef);
                      jas_iccprof_destroy((jas_iccprof_t *)iccstream);
                    }
                    iccstream = (jas_stream_t *)0x0;
                    _needcdef = (jas_stream_t *)0x0;
                    iVar2 = jp2_box_put((jp2_box_t *)ftyp,pjStack_48);
                    if (iVar2 == 0) {
                      jp2_box_destroy((jp2_box_t *)ftyp);
                      bVar1 = true;
                      iVar2 = image->clrspc_ >> 8;
                      if (iVar2 == 3) {
                        if ((image->numcmpts_ != 0) && ((*image->cmpts_)->type_ == 0)) {
                          bVar1 = false;
                        }
                      }
                      else if (iVar2 == 4) {
                        if (((2 < image->numcmpts_) && ((*image->cmpts_)->type_ == 0)) &&
                           ((image->cmpts_[1]->type_ == 1 && (image->cmpts_[2]->type_ == 2)))) {
                          bVar1 = false;
                        }
                      }
                      else {
                        if (iVar2 != 5) {
                          abort();
                        }
                        if ((((2 < image->numcmpts_) && ((*image->cmpts_)->type_ == 0)) &&
                            (image->cmpts_[1]->type_ == 1)) && (image->cmpts_[2]->type_ == 2)) {
                          bVar1 = false;
                        }
                      }
                      if (bVar1) {
                        ftyp = (jp2_ftyp_t *)jp2_box_create(0x63646566);
                        if ((jp2_box_t *)ftyp == (jp2_box_t *)0x0) {
                          jas_eprintf("cannot create CDEF box\n");
                          goto LAB_00124535;
                        }
                        *(ulong *)&((jp2_box_t *)ftyp)->data = (ulong)image->numcmpts_;
                        puVar4 = (uint_fast8_t *)
                                 jas_alloc2((((jp2_box_t *)ftyp)->data).ftyp.majver,0x18);
                        (((jp2_box_t *)ftyp)->data).bpcc.bpcs = puVar4;
                        if ((((jp2_box_t *)ftyp)->data).ftyp.minver == 0) goto LAB_00124535;
                        for (local_10c0 = 0; local_10c0 < image->numcmpts_;
                            local_10c0 = local_10c0 + 1) {
                          puVar5 = (ulong *)((((jp2_box_t *)ftyp)->data).bpcc.bpcs +
                                            (ulong)local_10c0 * 0x18);
                          *puVar5 = (ulong)local_10c0;
                          uVar6 = jp2_gettypeasoc(image->clrspc_,
                                                  (int)image->cmpts_[local_10c0]->type_);
                          puVar5[1] = uVar6 >> 0x10;
                          puVar5[2] = uVar6 & 0x7fff;
                        }
                        iVar2 = jp2_box_put((jp2_box_t *)ftyp,pjStack_48);
                        if (iVar2 != 0) {
                          jas_eprintf("cannot write CDEF box\n");
                          goto LAB_00124535;
                        }
                        jp2_box_destroy((jp2_box_t *)ftyp);
                      }
                      lVar7 = jas_stream_tell(pjStack_48);
                      jas_stream_rewind(pjStack_48);
                      ftyp = (jp2_ftyp_t *)jp2_box_create(0x6a703268);
                      if ((jp2_box_t *)ftyp == (jp2_box_t *)0x0) {
                        jas_eprintf("cannot create JP2H box\n");
                      }
                      else {
                        ((jp2_box_t *)ftyp)->len = lVar7 + 8;
                        iVar2 = jp2_box_put((jp2_box_t *)ftyp,out);
                        if (iVar2 == 0) {
                          jp2_box_destroy((jp2_box_t *)ftyp);
                          ftyp = (jp2_ftyp_t *)0x0;
                          iVar2 = jas_stream_copy(out,pjStack_48,(int)lVar7);
                          if (iVar2 == 0) {
                            jas_stream_close(pjStack_48);
                            pjStack_48 = (jas_stream_t *)0x0;
                            ftyp = (jp2_ftyp_t *)jp2_box_create(0x6a703263);
                            if ((jp2_box_t *)ftyp == (jp2_box_t *)0x0) {
                              jas_eprintf("cannot create JP2C box\n");
                            }
                            else {
                              ((jp2_box_t *)ftyp)->len = 0;
                              iVar2 = jp2_box_put((jp2_box_t *)ftyp,out);
                              if (iVar2 == 0) {
                                jp2_box_destroy((jp2_box_t *)ftyp);
                                ftyp = (jp2_ftyp_t *)0x0;
                                local_10e0 = optstr;
                                if (optstr == (char *)0x0) {
                                  local_10e0 = "";
                                }
                                sprintf((char *)&overhead,"%s\n_jp2overhead=%lu\n",local_10e0,
                                        out->rwcnt_);
                                iVar2 = jpc_encode(image,out,(char *)&overhead);
                                if (iVar2 == 0) {
                                  return 0;
                                }
                                jas_eprintf("jpc_encode failed\n");
                              }
                              else {
                                jas_eprintf("cannot write JP2C box\n");
                              }
                            }
                          }
                          else {
                            jas_eprintf("cannot copy stream\n");
                          }
                        }
                        else {
                          jas_eprintf("cannot write JP2H box\n");
                        }
                      }
                    }
                    else {
                      jas_eprintf("cannot write box\n");
                    }
                  }
                }
                else {
                  jas_eprintf("cannot write IHDR box\n");
                }
              }
            }
          }
          else {
            jas_eprintf("cannot write FTYP box\n");
          }
        }
      }
      else {
        jas_eprintf("cannot write JP box\n");
      }
    }
  }
LAB_00124535:
  if (iccstream != (jas_stream_t *)0x0) {
    jas_iccprof_destroy((jas_iccprof_t *)iccstream);
  }
  if (_needcdef != (jas_stream_t *)0x0) {
    jas_stream_close(_needcdef);
  }
  if (ftyp != (jp2_ftyp_t *)0x0) {
    jp2_box_destroy((jp2_box_t *)ftyp);
  }
  if (pjStack_48 != (jas_stream_t *)0x0) {
    jas_stream_close(pjStack_48);
  }
  return -1;
}

Assistant:

int jp2_encode(jas_image_t *image, jas_stream_t *out, const char *optstr)
{
	jp2_box_t *box;
	jp2_ftyp_t *ftyp;
	jp2_ihdr_t *ihdr;
	jas_stream_t *tmpstream;
	int allcmptssame;
	jp2_bpcc_t *bpcc;
	long len;
	uint_fast16_t cmptno;
	jp2_colr_t *colr;
	char buf[4096];
	uint_fast32_t overhead;
	jp2_cdefchan_t *cdefchanent;
	jp2_cdef_t *cdef;
	uint_fast32_t typeasoc;
	jas_iccprof_t *iccprof;
	jas_stream_t *iccstream;
	int pos;
	int needcdef;
	int prec;
	int sgnd;

	box = 0;
	tmpstream = 0;
	iccstream = 0;
	iccprof = 0;

	if (jas_image_numcmpts(image) < 1) {
		jas_eprintf("image must have at least one component\n");
		goto error;
	}

	allcmptssame = 1;
	sgnd = jas_image_cmptsgnd(image, 0);
	prec = jas_image_cmptprec(image, 0);
	for (unsigned i = 1; i < jas_image_numcmpts(image); ++i) {
		if (jas_image_cmptsgnd(image, i) != sgnd ||
		  jas_image_cmptprec(image, i) != prec) {
			allcmptssame = 0;
			break;
		}
	}

	/* Output the signature box. */

	if (!(box = jp2_box_create(JP2_BOX_JP))) {
		jas_eprintf("cannot create JP box\n");
		goto error;
	}
	box->data.jp.magic = JP2_JP_MAGIC;
	if (jp2_box_put(box, out)) {
		jas_eprintf("cannot write JP box\n");
		goto error;
	}
	jp2_box_destroy(box);
	box = 0;

	/* Output the file type box. */

	if (!(box = jp2_box_create(JP2_BOX_FTYP))) {
		jas_eprintf("cannot create FTYP box\n");
		goto error;
	}
	ftyp = &box->data.ftyp;
	ftyp->majver = JP2_FTYP_MAJVER;
	ftyp->minver = JP2_FTYP_MINVER;
	ftyp->numcompatcodes = 1;
	ftyp->compatcodes[0] = JP2_FTYP_COMPATCODE;
	if (jp2_box_put(box, out)) {
		jas_eprintf("cannot write FTYP box\n");
		goto error;
	}
	jp2_box_destroy(box);
	box = 0;

	/*
	 * Generate the data portion of the JP2 header box.
	 * We cannot simply output the header for this box
	 * since we do not yet know the correct value for the length
	 * field.
	 */

	if (!(tmpstream = jas_stream_memopen(0, 0))) {
		jas_eprintf("cannot create temporary stream\n");
		goto error;
	}

	/* Generate image header box. */

	if (!(box = jp2_box_create(JP2_BOX_IHDR))) {
		jas_eprintf("cannot create IHDR box\n");
		goto error;
	}
	ihdr = &box->data.ihdr;
	ihdr->width = jas_image_width(image);
	ihdr->height = jas_image_height(image);
	ihdr->numcmpts = jas_image_numcmpts(image);
	ihdr->bpc = allcmptssame ? JP2_SPTOBPC(jas_image_cmptsgnd(image, 0),
	  jas_image_cmptprec(image, 0)) : JP2_IHDR_BPCNULL;
	ihdr->comptype = JP2_IHDR_COMPTYPE;
	ihdr->csunk = 0;
	ihdr->ipr = 0;
	if (jp2_box_put(box, tmpstream)) {
		jas_eprintf("cannot write IHDR box\n");
		goto error;
	}
	jp2_box_destroy(box);
	box = 0;

	/* Generate bits per component box. */

	if (!allcmptssame) {
		if (!(box = jp2_box_create(JP2_BOX_BPCC))) {
			jas_eprintf("cannot create BPCC box\n");
			goto error;
		}
		bpcc = &box->data.bpcc;
		bpcc->numcmpts = jas_image_numcmpts(image);
		if (!(bpcc->bpcs = jas_alloc2(bpcc->numcmpts,
		  sizeof(uint_fast8_t)))) {
			jas_eprintf("memory allocation failed\n");
			goto error;
		}
		for (cmptno = 0; cmptno < bpcc->numcmpts; ++cmptno) {
			bpcc->bpcs[cmptno] = JP2_SPTOBPC(jas_image_cmptsgnd(image,
			  cmptno), jas_image_cmptprec(image, cmptno));
		}
		if (jp2_box_put(box, tmpstream)) {
			jas_eprintf("cannot write BPCC box\n");
			goto error;
		}
		jp2_box_destroy(box);
		box = 0;
	}

	/* Generate color specification box. */

	if (!(box = jp2_box_create(JP2_BOX_COLR))) {
		jas_eprintf("cannot create COLR box\n");
		goto error;
	}
	colr = &box->data.colr;
	switch (jas_image_clrspc(image)) {
	case JAS_CLRSPC_SRGB:
	case JAS_CLRSPC_SYCBCR:
	case JAS_CLRSPC_SGRAY:
		colr->method = JP2_COLR_ENUM;
		colr->csid = clrspctojp2(jas_image_clrspc(image));
		colr->pri = JP2_COLR_PRI;
		colr->approx = 0;
		break;
	default:
		colr->method = JP2_COLR_ICC;
		colr->pri = JP2_COLR_PRI;
		colr->approx = 0;
		/* Ensure that cmprof_ is not null. */
		if (!jas_image_cmprof(image)) {
			jas_eprintf("CM profile is null\n");
			goto error;
		}
		if (!(iccprof = jas_iccprof_createfromcmprof(
		  jas_image_cmprof(image)))) {
			jas_eprintf("cannot create ICC profile\n");
			goto error;
		}
		if (!(iccstream = jas_stream_memopen(0, 0))) {
			jas_eprintf("cannot create temporary stream\n");
			goto error;
		}
		if (jas_iccprof_save(iccprof, iccstream)) {
			jas_eprintf("cannot write ICC profile\n");
			goto error;
		}
		if ((pos = jas_stream_tell(iccstream)) < 0) {
			jas_eprintf("cannot get stream position\n");
			goto error;
		}
		colr->iccplen = pos;
		if (!(colr->iccp = jas_malloc(pos))) {
			jas_eprintf("memory allocation failed\n");
			goto error;
		}
		jas_stream_rewind(iccstream);
		if (jas_stream_read(iccstream, colr->iccp, colr->iccplen) !=
		  colr->iccplen) {
			jas_eprintf("cannot read temporary stream\n");
			goto error;
		}
		jas_stream_close(iccstream);
		iccstream = 0;
		jas_iccprof_destroy(iccprof);
		iccprof = 0;
		break;
	}
	if (jp2_box_put(box, tmpstream)) {
		jas_eprintf("cannot write box\n");
		goto error;
	}
	jp2_box_destroy(box);
	box = 0;

	needcdef = 1;
	switch (jas_clrspc_fam(jas_image_clrspc(image))) {
	case JAS_CLRSPC_FAM_RGB:
		if (jas_image_numcmpts(image) >= 3 &&
		  jas_image_cmpttype(image, 0) ==
		  JAS_IMAGE_CT_COLOR(JAS_CLRSPC_CHANIND_RGB_R) &&
		  jas_image_cmpttype(image, 1) ==
		  JAS_IMAGE_CT_COLOR(JAS_CLRSPC_CHANIND_RGB_G) &&
		  jas_image_cmpttype(image, 2) ==
		  JAS_IMAGE_CT_COLOR(JAS_CLRSPC_CHANIND_RGB_B))
			needcdef = 0;
		break;
	case JAS_CLRSPC_FAM_YCBCR:
		if (jas_image_numcmpts(image) >= 3 &&
		  jas_image_cmpttype(image, 0) ==
		  JAS_IMAGE_CT_COLOR(JAS_CLRSPC_CHANIND_YCBCR_Y) &&
		  jas_image_cmpttype(image, 1) ==
		  JAS_IMAGE_CT_COLOR(JAS_CLRSPC_CHANIND_YCBCR_CB) &&
		  jas_image_cmpttype(image, 2) ==
		  JAS_IMAGE_CT_COLOR(JAS_CLRSPC_CHANIND_YCBCR_CR))
			needcdef = 0;
		break;
	case JAS_CLRSPC_FAM_GRAY:
		if (jas_image_numcmpts(image) >= 1 &&
		  jas_image_cmpttype(image, 0) ==
		  JAS_IMAGE_CT_COLOR(JAS_IMAGE_CT_GRAY_Y))
			needcdef = 0;
		break;
	default:
		abort();
		break;
	}

	if (needcdef) {
		if (!(box = jp2_box_create(JP2_BOX_CDEF))) {
			jas_eprintf("cannot create CDEF box\n");
			goto error;
		}
		cdef = &box->data.cdef;
		cdef->numchans = jas_image_numcmpts(image);
		cdef->ents = jas_alloc2(cdef->numchans, sizeof(jp2_cdefchan_t));
		if (!cdef->ents) {
			goto error;
		}
		for (unsigned i = 0; i < jas_image_numcmpts(image); ++i) {
			cdefchanent = &cdef->ents[i];
			cdefchanent->channo = i;
			typeasoc = jp2_gettypeasoc(jas_image_clrspc(image), jas_image_cmpttype(image, i));
			cdefchanent->type = typeasoc >> 16;
			cdefchanent->assoc = typeasoc & 0x7fff;
		}
		if (jp2_box_put(box, tmpstream)) {
			jas_eprintf("cannot write CDEF box\n");
			goto error;
		}
		jp2_box_destroy(box);
		box = 0;
	}

	/* Determine the total length of the JP2 header box. */

	len = jas_stream_tell(tmpstream);
	jas_stream_rewind(tmpstream);

	/*
	 * Output the JP2 header box and all of the boxes which it contains.
	 */

	if (!(box = jp2_box_create(JP2_BOX_JP2H))) {
		jas_eprintf("cannot create JP2H box\n");
		goto error;
	}
	box->len = len + JP2_BOX_HDRLEN(false);
	if (jp2_box_put(box, out)) {
		jas_eprintf("cannot write JP2H box\n");
		goto error;
	}
	jp2_box_destroy(box);
	box = 0;

	if (jas_stream_copy(out, tmpstream, len)) {
		jas_eprintf("cannot copy stream\n");
		goto error;
	}

	jas_stream_close(tmpstream);
	tmpstream = 0;

	/*
	 * Output the contiguous code stream box.
	 */

	if (!(box = jp2_box_create(JP2_BOX_JP2C))) {
		jas_eprintf("cannot create JP2C box\n");
		goto error;
	}
	box->len = 0;
	if (jp2_box_put(box, out)) {
		jas_eprintf("cannot write JP2C box\n");
		goto error;
	}
	jp2_box_destroy(box);
	box = 0;

	/* Output the JPEG-2000 code stream. */

	overhead = jas_stream_getrwcount(out);
	sprintf(buf, "%s\n_jp2overhead=%lu\n", (optstr ? optstr : ""),
	  (unsigned long) overhead);

	if (jpc_encode(image, out, buf)) {
		jas_eprintf("jpc_encode failed\n");
		goto error;
	}

	return 0;

error:

	if (iccprof) {
		jas_iccprof_destroy(iccprof);
	}
	if (iccstream) {
		jas_stream_close(iccstream);
	}
	if (box) {
		jp2_box_destroy(box);
	}
	if (tmpstream) {
		jas_stream_close(tmpstream);
	}
	return -1;
}